

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

float rr::advblend::softlight(float src,float dst)

{
  float fVar1;
  float dst_local;
  float src_local;
  
  if (0.5 < src) {
    if (0.25 < dst) {
      fVar1 = deFloatSqrt(dst);
      dst_local = (src + src + -1.0) * (fVar1 - dst) + dst;
    }
    else {
      dst_local = (src + src + -1.0) * dst * ((dst * 16.0 + -12.0) * dst + 3.0) + dst;
    }
  }
  else {
    dst_local = -((1.0 - (src + src)) * dst) * (1.0 - dst) + dst;
  }
  return dst_local;
}

Assistant:

inline float softlight (float src, float dst)
{
	if (src <= 0.5f)
		return dst - (1.0f - 2.0f*src)*dst*(1.0f-dst);
	else if (dst <= 0.25f)
		return dst + (2.0f*src - 1.0f)*dst*((16.0f*dst - 12.0f)*dst + 3.0f);
	else
		return dst + (2.0f*src - 1.0f)*(deFloatSqrt(dst)-dst);
}